

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O1

Aig_Man_t * Iso_ManFilterPos_old(Aig_Man_t *pAig,int fVerbose)

{
  int iVar1;
  long lVar2;
  uint *puVar3;
  void *pvVar4;
  Aig_Man_t *pAVar5;
  Vec_Int_t *pVVar6;
  uint *__ptr;
  int *piVar7;
  Vec_Int_t *__ptr_00;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint local_74;
  uint *local_70;
  uint local_64;
  uint *local_60;
  uint local_54;
  uint *local_50;
  Aig_Man_t *local_48;
  Aig_Man_t *local_40;
  long local_38;
  
  uVar8 = pAig->nObjs[3] - pAig->nRegs;
  local_48 = pAig;
  puVar3 = (uint *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar8 - 1) {
    uVar9 = uVar8;
  }
  puVar3[1] = 0;
  *puVar3 = uVar9;
  if (uVar9 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar9 * 8);
  }
  *(void **)(puVar3 + 2) = pvVar4;
  local_70 = (uint *)malloc(0x10);
  local_70[1] = 0;
  *local_70 = uVar9;
  if (uVar9 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar9 << 3);
  }
  *(void **)(local_70 + 2) = pvVar4;
  local_74 = 0;
  if (0 < (int)uVar8) {
    do {
      pAVar5 = Saig_ManDupCones(local_48,(int *)&local_74,1);
      pVVar6 = Saig_ManFindIsoPerm(pAVar5,0);
      uVar9 = puVar3[1];
      uVar12 = *puVar3;
      if (uVar9 == uVar12) {
        if ((int)uVar12 < 0x10) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(*(void **)(puVar3 + 2),0x80);
          }
          uVar11 = 0x10;
        }
        else {
          uVar11 = uVar12 * 2;
          if ((int)uVar11 <= (int)uVar12) goto LAB_0062610d;
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar4 = malloc((ulong)uVar12 << 4);
          }
          else {
            pvVar4 = realloc(*(void **)(puVar3 + 2),(ulong)uVar12 << 4);
          }
        }
        *(void **)(puVar3 + 2) = pvVar4;
        *puVar3 = uVar11;
      }
LAB_0062610d:
      puVar3[1] = uVar9 + 1;
      *(Aig_Man_t **)(*(long *)(puVar3 + 2) + (long)(int)uVar9 * 8) = pAVar5;
      uVar9 = local_70[1];
      uVar12 = *local_70;
      if (uVar9 == uVar12) {
        if ((int)uVar12 < 0x10) {
          if (*(void **)(local_70 + 2) == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(*(void **)(local_70 + 2),0x80);
          }
          uVar11 = 0x10;
        }
        else {
          uVar11 = uVar12 * 2;
          if ((int)uVar11 <= (int)uVar12) goto LAB_00626192;
          if (*(void **)(local_70 + 2) == (void *)0x0) {
            pvVar4 = malloc((ulong)uVar12 << 4);
          }
          else {
            pvVar4 = realloc(*(void **)(local_70 + 2),(ulong)uVar12 << 4);
          }
        }
        *(void **)(local_70 + 2) = pvVar4;
        *local_70 = uVar11;
      }
LAB_00626192:
      local_70[1] = uVar9 + 1;
      *(Vec_Int_t **)(*(long *)(local_70 + 2) + (long)(int)uVar9 * 8) = pVVar6;
      local_74 = local_74 + 1;
    } while ((int)local_74 < (int)uVar8);
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar4 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar4;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  uVar9 = puVar3[1];
  local_74 = 0;
  if (0 < (int)uVar9) {
    local_38 = *(long *)(puVar3 + 2);
    uVar8 = __ptr[1];
    uVar13 = 0;
    puVar10 = local_70;
    local_60 = __ptr;
    local_54 = uVar9;
    local_50 = puVar3;
    do {
      if ((int)uVar13 < 0) {
        __ptr[1] = uVar8;
        goto LAB_0062652c;
      }
      local_40 = *(Aig_Man_t **)(local_38 + uVar13 * 8);
      local_64 = uVar8;
      if ((int)uVar8 < 1) {
        uVar12 = 0;
      }
      else {
        lVar2 = *(long *)(__ptr + 2);
        uVar9 = pVVar6->nSize;
        if (pVVar6->nSize < 1) {
          uVar9 = 0;
        }
        uVar13 = 0;
        do {
          if (uVar9 == uVar13) {
            local_60[1] = local_64;
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar1 = pVVar6->pArray[uVar13];
          if (((((long)iVar1 < 0) || ((int)puVar10[1] <= iVar1)) || ((long)(int)local_74 < 0)) ||
             ((int)puVar10[1] <= (int)local_74)) {
            local_60[1] = local_64;
            goto LAB_0062652c;
          }
          __ptr_00 = Iso_ManFindMapping(*(Aig_Man_t **)(lVar2 + uVar13 * 8),local_40,
                                        *(Vec_Int_t **)(*(long *)(puVar10 + 2) + (long)iVar1 * 8),
                                        *(Vec_Int_t **)
                                         (*(long *)(puVar10 + 2) + (long)(int)local_74 * 8),0);
          if (__ptr_00 != (Vec_Int_t *)0x0) {
            if (__ptr_00->pArray != (int *)0x0) {
              free(__ptr_00->pArray);
              __ptr_00->pArray = (int *)0x0;
            }
            free(__ptr_00);
            break;
          }
          uVar13 = uVar13 + 1;
          puVar10 = local_70;
        } while (uVar8 != uVar13);
        uVar12 = (uint)uVar13;
        puVar10 = local_70;
        __ptr = local_60;
        puVar3 = local_50;
        uVar9 = local_54;
      }
      uVar11 = local_64;
      uVar8 = local_64;
      if (uVar12 == local_64) {
        uVar8 = *__ptr;
        if (local_64 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar12 = 0x10;
          }
          else {
            uVar12 = uVar8 * 2;
            if ((int)uVar12 <= (int)uVar8) goto LAB_0062639f;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc((ulong)uVar8 << 4);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar8 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = uVar12;
        }
LAB_0062639f:
        uVar8 = uVar11 + 1;
        *(Aig_Man_t **)(*(long *)(__ptr + 2) + (long)(int)uVar11 * 8) = local_40;
        Vec_IntPush(pVVar6,local_74);
        puVar10 = local_70;
      }
      local_74 = local_74 + 1;
      uVar13 = (ulong)local_74;
    } while ((int)local_74 < (int)uVar9);
    __ptr[1] = uVar8;
  }
  local_74 = 0;
  if (0 < (int)uVar9) {
    lVar2 = *(long *)(puVar3 + 2);
    do {
      if ((int)local_74 < 0) goto LAB_0062652c;
      Aig_ManStop(*(Aig_Man_t **)(lVar2 + (ulong)local_74 * 8));
      local_74 = local_74 + 1;
    } while ((int)local_74 < (int)uVar9);
  }
  if (*(void **)(puVar3 + 2) != (void *)0x0) {
    free(*(void **)(puVar3 + 2));
    puVar3[2] = 0;
    puVar3[3] = 0;
  }
  free(puVar3);
  uVar9 = local_70[1];
  local_74 = 0;
  if (0 < (int)uVar9) {
    lVar2 = *(long *)(local_70 + 2);
    do {
      if ((int)local_74 < 0) {
LAB_0062652c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = *(void **)(lVar2 + (ulong)local_74 * 8);
      if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar4 + 8));
        *(undefined8 *)((long)pvVar4 + 8) = 0;
      }
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
      local_74 = local_74 + 1;
    } while ((int)local_74 < (int)uVar9);
  }
  puVar3 = local_70;
  if (*(void **)(local_70 + 2) != (void *)0x0) {
    free(*(void **)(local_70 + 2));
    puVar3[2] = 0;
    puVar3[3] = 0;
  }
  free(puVar3);
  piVar7 = pVVar6->pArray;
  pAVar5 = Saig_ManDupCones(local_48,piVar7,pVVar6->nSize);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (piVar7 != (int *)0x0) {
    free(piVar7);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  return pAVar5;
}

Assistant:

Aig_Man_t * Iso_ManFilterPos_old( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Ptr_t * vParts, * vPerms, * vAigs;
    Vec_Int_t * vPos, * vMap;
    Aig_Man_t * pPart, * pTemp;
    int i, k, nPos;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vParts = Vec_PtrAlloc( nPos );
    vPerms = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        vMap  = Saig_ManFindIsoPerm( pPart, fVeryVerbose );
        Vec_PtrPush( vParts, pPart ); 
        Vec_PtrPush( vPerms, vMap );
    }
//    s_Counter = 0;

    // check AIGs for each PO
    vAigs = Vec_PtrAlloc( 1000 );
    vPos  = Vec_IntAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
    {
        if ( fVeryVerbose )
        {
            printf( "AIG %4d : ", i );
            Aig_ManPrintStats( pPart );
        }
        Vec_PtrForEachEntry( Aig_Man_t *, vAigs, pTemp, k )
        {
            if ( fVeryVerbose )
                printf( "Comparing AIG %4d and AIG %4d.  ", Vec_IntEntry(vPos,k), i );
            vMap = Iso_ManFindMapping( pTemp, pPart, 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, Vec_IntEntry(vPos,k)), 
                (Vec_Int_t *)Vec_PtrEntry(vPerms, i),
                fVeryVerbose );
            if ( vMap != NULL )
            {
                if ( fVeryVerbose )
                    printf( "Found match\n" );
//                if ( fVerbose )
//                    printf( "Found match for AIG %4d and AIG %4d.\n", Vec_IntEntry(vPos,k), i );
                Vec_IntFree( vMap );
                break;
            }
            if ( fVeryVerbose )
                printf( "No match.\n" );
        }
        if ( k == Vec_PtrSize(vAigs) )
        {
            Vec_PtrPush( vAigs, pPart );
            Vec_IntPush( vPos, i );
        }
    }
    // delete AIGs
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pPart, i )
        Aig_ManStop( pPart );
    Vec_PtrFree( vParts );
    Vec_PtrForEachEntry( Vec_Int_t *, vPerms, vMap, i )
        Vec_IntFree( vMap );
    Vec_PtrFree( vPerms );
    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vPos), Vec_IntSize(vPos) );
    Vec_PtrFree( vAigs );
    Vec_IntFree( vPos );

//    printf( "The number of all checks %d.  Complex checks %d.\n", nPos*(nPos-1)/2, s_Counter );
    return pPart;
}